

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QWidget * embeddedWidget(QWidget *w)

{
  bool bVar1;
  QWidget *pQVar2;
  long lVar3;
  QAbstractScrollArea *this;
  
  pQVar2 = (QWidget *)QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
  if (pQVar2 == (QWidget *)0x0) {
    lVar3 = QMetaObject::cast((QObject *)&QAbstractSpinBox::staticMetaObject);
    if (lVar3 != 0) {
      pQVar2 = (QWidget *)qt_qFindChild_helper(lVar3,0,0,&QLineEdit::staticMetaObject,1);
      return pQVar2;
    }
    this = (QAbstractScrollArea *)
           QMetaObject::cast((QObject *)&QAbstractScrollArea::staticMetaObject);
    pQVar2 = w;
    if (this != (QAbstractScrollArea *)0x0) {
      pQVar2 = QAbstractScrollArea::viewport(this);
      return pQVar2;
    }
  }
  else {
    bVar1 = QComboBox::isEditable((QComboBox *)pQVar2);
    if (bVar1) {
      pQVar2 = &QComboBox::lineEdit((QComboBox *)pQVar2)->super_QWidget;
      return pQVar2;
    }
  }
  return pQVar2;
}

Assistant:

static QWidget *embeddedWidget(QWidget *w)
{
#if QT_CONFIG(combobox)
    if (QComboBox *cmb = qobject_cast<QComboBox *>(w)) {
        if (cmb->isEditable())
            return cmb->lineEdit();
        else
            return cmb;
    }
#endif

#if QT_CONFIG(spinbox)
    if (QAbstractSpinBox *sb = qobject_cast<QAbstractSpinBox *>(w))
        return sb->findChild<QLineEdit *>();
#endif

#if QT_CONFIG(scrollarea)
    if (QAbstractScrollArea *sa = qobject_cast<QAbstractScrollArea *>(w))
        return sa->viewport();
#endif

    return w;
}